

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>::
insertIfNotContains(QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
                    *this,pair<int,_int> k,function<bool_(const_void_*,_void_*)> *f)

{
  long lVar1;
  QHash<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_> *in_RDI;
  long in_FS_OFFSET;
  QWriteLocker locker;
  TryEmplaceResult r;
  QReadWriteLock *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  pair<int,_int> *key;
  byte local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  QWriteLocker::QWriteLocker
            ((QWriteLocker *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  QHash<std::pair<int,int>,std::function<bool(void_const*,void*)>>::
  tryEmplace<std::function<bool(void_const*,void*)>const&>
            (in_RDI,key,
             (function<bool_(const_void_*,_void_*)> *)
             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  local_18 = (byte)key;
  QWriteLocker::~QWriteLocker((QWriteLocker *)0x3a6a84);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_18 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool insertIfNotContains(Key k, const T &f)
    {
        const QWriteLocker locker(&lock);
        auto r = map.tryEmplace(k, f);
        return r.inserted;
    }